

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O1

void __thiscall cmGlobalGenerator::Generate(cmGlobalGenerator *this)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  cmMakefile *this_00;
  cmake *pcVar3;
  cmExternalMakefileProjectGenerator *pcVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  pointer ppcVar8;
  _Rb_tree_node_base *p_Var9;
  ostream *poVar10;
  _Base_ptr p_Var11;
  PolicyID id;
  PolicyID id_00;
  char *__end;
  ulong uVar12;
  ostringstream w;
  undefined1 local_1d8 [32];
  cmListFileBacktrace local_1b8;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  (*this->_vptr_cmGlobalGenerator[0x31])();
  ProcessEvaluationFiles(this);
  ppcVar8 = (this->LocalGenerators).
            super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->LocalGenerators).
      super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppcVar8) {
    pcVar2 = local_1a8 + 0x10;
    uVar12 = 0;
    do {
      this->CurrentConfigureMakefile = ppcVar8[uVar12]->Makefile;
      (*ppcVar8[uVar12]->_vptr_cmLocalGenerator[2])();
      this_00 = (this->LocalGenerators).
                super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
                super__Vector_impl_data._M_start[uVar12]->Makefile;
      local_1a8._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a8,"CMAKE_SKIP_INSTALL_RULES","");
      bVar5 = cmMakefile::IsOn(this_00,(string *)local_1a8);
      if ((pointer)local_1a8._0_8_ != pcVar2) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      if (!bVar5) {
        cmLocalGenerator::GenerateInstallRules
                  ((this->LocalGenerators).
                   super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar12]);
      }
      cmLocalGenerator::GenerateTestFiles
                ((this->LocalGenerators).
                 super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl
                 .super__Vector_impl_data._M_start[uVar12]);
      pcVar3 = this->CMakeInstance;
      local_1a8._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"Generating","");
      cmake::UpdateProgress
                (pcVar3,(string *)local_1a8,
                 ((float)uVar12 + 1.0) /
                 (float)(ulong)((long)(this->LocalGenerators).
                                      super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->LocalGenerators).
                                      super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3));
      if ((pointer)local_1a8._0_8_ != pcVar2) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      uVar12 = (ulong)((int)uVar12 + 1);
      ppcVar8 = (this->LocalGenerators).
                super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar12 < (ulong)((long)(this->LocalGenerators).
                                    super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppcVar8 >> 3)
            );
  }
  this->CurrentConfigureMakefile = (cmMakefile *)0x0;
  GenerateCPackPropertiesFile(this);
  p_Var9 = (this->BuildExportSets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    bVar5 = (_Rb_tree_header *)p_Var9 != &(this->BuildExportSets)._M_t._M_impl.super__Rb_tree_header
    ;
    if (!bVar5) {
LAB_0019d2d6:
      CheckRuleHashes(this);
      WriteSummary(this);
      pcVar4 = (this->ExtraGenerator)._M_t.
               super___uniq_ptr_impl<cmExternalMakefileProjectGenerator,_std::default_delete<cmExternalMakefileProjectGenerator>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmExternalMakefileProjectGenerator_*,_std::default_delete<cmExternalMakefileProjectGenerator>_>
               .super__Head_base<0UL,_cmExternalMakefileProjectGenerator_*,_false>._M_head_impl;
      if (pcVar4 != (cmExternalMakefileProjectGenerator *)0x0) {
        (*pcVar4->_vptr_cmExternalMakefileProjectGenerator[4])();
      }
      if ((this->CMP0042WarnTargets)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        cmPolicies::GetPolicyWarning_abi_cxx11_((string *)local_1d8,(cmPolicies *)0x2a,id);
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,(char *)local_1d8._0_8_,local_1d8._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
        if ((element_type *)local_1d8._0_8_ != (element_type *)(local_1d8 + 0x10)) {
          operator_delete((void *)local_1d8._0_8_,local_1d8._16_8_ + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"MACOSX_RPATH is not specified for the following targets:\n"
                   ,0x39);
        p_Var11 = (this->CMP0042WarnTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        p_Var1 = &(this->CMP0042WarnTargets)._M_t._M_impl.super__Rb_tree_header;
        if ((_Rb_tree_header *)p_Var11 != p_Var1) {
          do {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1a8,*(char **)(p_Var11 + 1),
                                 (long)p_Var11[1]._M_parent);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
            p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11);
          } while ((_Rb_tree_header *)p_Var11 != p_Var1);
        }
        pcVar3 = this->CMakeInstance;
        std::__cxx11::stringbuf::str();
        local_1b8.TopEntry.
        super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_1b8.TopEntry.
        super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        cmake::IssueMessage(pcVar3,AUTHOR_WARNING,(string *)local_1d8,&local_1b8);
        if (local_1b8.TopEntry.
            super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_1b8.TopEntry.
                     super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        if ((element_type *)local_1d8._0_8_ != (element_type *)(local_1d8 + 0x10)) {
          operator_delete((void *)local_1d8._0_8_,local_1d8._16_8_ + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
      }
      if ((this->CMP0068WarnTargets)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        cmPolicies::GetPolicyWarning_abi_cxx11_((string *)local_1d8,(cmPolicies *)0x44,id_00);
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,(char *)local_1d8._0_8_,local_1d8._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar10,
                   "\nFor compatibility with older versions of CMake, the install_name fields for the following targets are still affected by RPATH settings:\n"
                   ,0x89);
        if ((element_type *)local_1d8._0_8_ != (element_type *)(local_1d8 + 0x10)) {
          operator_delete((void *)local_1d8._0_8_,local_1d8._16_8_ + 1);
        }
        p_Var11 = (this->CMP0068WarnTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        p_Var1 = &(this->CMP0068WarnTargets)._M_t._M_impl.super__Rb_tree_header;
        if ((_Rb_tree_header *)p_Var11 != p_Var1) {
          do {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1a8,*(char **)(p_Var11 + 1),
                                 (long)p_Var11[1]._M_parent);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
            p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11);
          } while ((_Rb_tree_header *)p_Var11 != p_Var1);
        }
        pcVar3 = this->CMakeInstance;
        std::__cxx11::stringbuf::str();
        local_1b8.TopEntry.
        super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_1b8.TopEntry.
        super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        cmake::IssueMessage(pcVar3,AUTHOR_WARNING,(string *)local_1d8,&local_1b8);
        if (local_1b8.TopEntry.
            super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_1b8.TopEntry.
                     super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        if ((element_type *)local_1d8._0_8_ != (element_type *)(local_1d8 + 0x10)) {
          operator_delete((void *)local_1d8._0_8_,local_1d8._16_8_ + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
      }
      pcVar3 = this->CMakeInstance;
      local_1a8._0_8_ = local_1a8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"Generating done","");
      cmake::UpdateProgress(pcVar3,(string *)local_1a8,-1.0);
      if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      return;
    }
    bVar6 = cmExportFileGenerator::GenerateImportFile(*(cmExportFileGenerator **)(p_Var9 + 2));
    if (!bVar6) {
      if (((cmSystemTools::s_ErrorOccured == false) && (cmSystemTools::s_FatalErrorOccured == false)
          ) && (bVar7 = cmSystemTools::GetInterruptFlag(), !bVar7)) {
        pcVar3 = this->CMakeInstance;
        local_1a8._0_8_ = local_1a8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1a8,"Could not write export file.","");
        local_1d8._0_8_ = (element_type *)0x0;
        local_1d8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        cmake::IssueMessage(pcVar3,FATAL_ERROR,(string *)local_1a8,(cmListFileBacktrace *)local_1d8)
        ;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d8._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d8._8_8_);
        }
        if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
          operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
        }
      }
      if (!bVar6) {
        if (bVar5) {
          return;
        }
        goto LAB_0019d2d6;
      }
    }
    p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
  } while( true );
}

Assistant:

void cmGlobalGenerator::Generate()
{
  // Create a map from local generator to the complete set of targets
  // it builds by default.
  this->InitializeProgressMarks();

  this->ProcessEvaluationFiles();

  // Generate project files
  for (unsigned int i = 0; i < this->LocalGenerators.size(); ++i) {
    this->SetCurrentMakefile(this->LocalGenerators[i]->GetMakefile());
    this->LocalGenerators[i]->Generate();
    if (!this->LocalGenerators[i]->GetMakefile()->IsOn(
          "CMAKE_SKIP_INSTALL_RULES")) {
      this->LocalGenerators[i]->GenerateInstallRules();
    }
    this->LocalGenerators[i]->GenerateTestFiles();
    this->CMakeInstance->UpdateProgress(
      "Generating",
      (static_cast<float>(i) + 1.0f) /
        static_cast<float>(this->LocalGenerators.size()));
  }
  this->SetCurrentMakefile(nullptr);

  if (!this->GenerateCPackPropertiesFile()) {
    this->GetCMakeInstance()->IssueMessage(
      MessageType::FATAL_ERROR, "Could not write CPack properties file.");
  }

  for (auto& buildExpSet : this->BuildExportSets) {
    if (!buildExpSet.second->GenerateImportFile()) {
      if (!cmSystemTools::GetErrorOccuredFlag()) {
        this->GetCMakeInstance()->IssueMessage(MessageType::FATAL_ERROR,
                                               "Could not write export file.");
      }
      return;
    }
  }
  // Update rule hashes.
  this->CheckRuleHashes();

  this->WriteSummary();

  if (this->ExtraGenerator) {
    this->ExtraGenerator->Generate();
  }

  if (!this->CMP0042WarnTargets.empty()) {
    std::ostringstream w;
    w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0042) << "\n";
    w << "MACOSX_RPATH is not specified for"
         " the following targets:\n";
    for (std::string const& t : this->CMP0042WarnTargets) {
      w << " " << t << "\n";
    }
    this->GetCMakeInstance()->IssueMessage(MessageType::AUTHOR_WARNING,
                                           w.str());
  }

  if (!this->CMP0068WarnTargets.empty()) {
    std::ostringstream w;
    /* clang-format off */
    w <<
      cmPolicies::GetPolicyWarning(cmPolicies::CMP0068) << "\n"
      "For compatibility with older versions of CMake, the install_name "
      "fields for the following targets are still affected by RPATH "
      "settings:\n"
      ;
    /* clang-format on */
    for (std::string const& t : this->CMP0068WarnTargets) {
      w << " " << t << "\n";
    }
    this->GetCMakeInstance()->IssueMessage(MessageType::AUTHOR_WARNING,
                                           w.str());
  }

  this->CMakeInstance->UpdateProgress("Generating done", -1);
}